

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_14::FatalConditionHandler::handleSignal(int sig)

{
  int in_EDI;
  SignalDefs *def;
  size_t i;
  char *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_41 [17];
  undefined8 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  ulong local_18;
  
  local_18 = 0;
  while ((local_18 < 6 &&
         (in_stack_ffffffffffffffe0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((anonymous_namespace)::signalDefs + local_18 * 0x10),
         in_EDI != *(int *)&(in_stack_ffffffffffffffe0->_M_dataplus)._M_p))) {
    local_18 = local_18 + 1;
  }
  reset();
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (allocator<char> *)in_stack_ffffffffffffffd0);
  reportFatal((string *)i);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(local_41);
  raise(in_EDI);
  return;
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }